

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void __thiscall libserver::server::server(server *this)

{
  ptime pVar1;
  ptime local_38;
  date_type local_2c;
  time_duration_type local_28;
  
  (this->super_enable_shared_from_this<libserver::server>).weak_this_.px = (element_type *)0x0;
  (this->super_enable_shared_from_this<libserver::server>).weak_this_.pn.pi_ =
       (sp_counted_base *)0x0;
  boost::asio::detail::
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>
            ((io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)&this->socket,&io_service,(type *)0x0);
  (this->client_name)._M_dataplus._M_p = (pointer)&(this->client_name).field_2;
  (this->client_name)._M_string_length = 0;
  (this->client_name).field_2._M_local_buf[0] = '\0';
  local_2c.
  super_date<boost::gregorian::date,_boost::gregorian::gregorian_calendar,_boost::gregorian::date_duration>
  .days_ = (date<boost::gregorian::date,_boost::gregorian::gregorian_calendar,_boost::gregorian::date_duration>
            )0xfffffffe;
  local_28.
  super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
  .ticks_.value_ =
       (time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
        )(impl_type)0x7ffffffffffffffe;
  boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>::
  counted_time_rep((counted_time_rep<boost::posix_time::millisec_posix_time_system_config> *)
                   &local_38,&local_2c,&local_28);
  (this->_ping).
  super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
  .time_.time_count_.value_ =
       (int_type)
       local_38.
       super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
       .time_.time_count_.value_;
  this->_is_reading = false;
  this->_num_bytes_read = 0;
  pVar1 = boost::date_time::microsec_clock<boost::posix_time::ptime>::create_time
                    (boost::date_time::c_time::localtime);
  (this->_ping).
  super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
  .time_.time_count_.value_ =
       (int_type)
       pVar1.
       super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
       .time_.time_count_.value_;
  return;
}

Assistant:

libserver::server::server() : socket(io_service)
{
    _is_reading = false;
    _num_bytes_read = 0;
    _ping = boost::posix_time::microsec_clock::local_time();
}